

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  iterator piVar3;
  char *pcVar4;
  ostream *poVar5;
  graph *pgVar6;
  void *pvVar7;
  span<const_mpt::item<mpt::layout::graph>_> sVar8;
  span<const_float> sVar9;
  span<const_float> local_150;
  point<float> local_13c;
  fpoint fp;
  color col;
  property *p;
  const_iterator __end2;
  const_iterator __begin2;
  object *__range2;
  object *o;
  item<mpt::layout::graph> *g;
  iterator __end1;
  iterator __begin1;
  size_t local_78;
  span<const_mpt::item<mpt::layout::graph>_> *local_70;
  span<const_mpt::item<mpt::layout::graph>_> *__range1;
  layout local_58 [8];
  layout lay;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  mtrace();
  mpt::layout::layout(local_58);
  if (argc < 2) {
    mpt::warning("main","%s","missing layout argument");
    argv_local._4_4_ = 1;
    __range1._0_4_ = 1;
  }
  else {
    bVar1 = mpt::layout::open((char *)local_58);
    if ((bVar1 & 1) == 0) {
      mpt::error("main","%s: %s","unable to open layout",argv[1]);
      argv_local._4_4_ = 2;
      __range1._0_4_ = 1;
    }
    else {
      mpt::logger::default_instance();
      bVar1 = mpt::layout::load((logger *)local_58);
      if ((bVar1 & 1) == 0) {
        mpt::error("main","%s: %s","unable to load layout",argv[1]);
        argv_local._4_4_ = 3;
        __range1._0_4_ = 1;
      }
      else {
        sVar8 = mpt::layout::graphs(local_58);
        local_78 = sVar8._len;
        __begin1 = sVar8._base;
        local_70 = (span<const_mpt::item<mpt::layout::graph>_> *)&__begin1;
        __end1 = mpt::span<const_mpt::item<mpt::layout::graph>_>::begin(local_70);
        piVar3 = mpt::span<const_mpt::item<mpt::layout::graph>_>::end(local_70);
        for (; __end1 != piVar3; __end1 = __end1 + 0x20) {
          pcVar4 = (char *)mpt::identifier::name();
          poVar5 = std::operator<<((ostream *)&std::cout,pcVar4);
          poVar5 = std::operator<<(poVar5," {");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pgVar6 = mpt::reference<mpt::layout::graph>::instance
                             ((reference<mpt::layout::graph> *)__end1);
          mpt::object::begin((const_iterator *)&__end2._pos,(object *)(pgVar6 + 0x18));
          mpt::object::end((const_iterator *)&p,(object *)(pgVar6 + 0x18));
          while( true ) {
            bVar2 = operator!=((const_iterator *)&__end2._pos,(const_iterator *)&p);
            if (!bVar2) break;
            register0x00000000 =
                 mpt::object::const_iterator::operator*((const_iterator *)&__end2._pos);
            mpt::color::color((color *)&fp,0,0,0,0xff);
            bVar2 = mpt::value::get<mpt::color>(&stack0xfffffffffffffed0->val,(color *)&fp);
            if (bVar2) {
              poVar5 = std::operator<<((ostream *)&std::cout,"  ");
              poVar5 = std::operator<<(poVar5,stack0xfffffffffffffed0->name);
              poVar5 = std::operator<<(poVar5," = ");
              pvVar7 = (void *)operator<<(poVar5,(color *)&fp);
              std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
            }
            else {
              mpt::fpoint::fpoint((fpoint *)&local_13c,0.0,0.0);
              bVar2 = mpt::value::get<mpt::fpoint>
                                (&stack0xfffffffffffffed0->val,(fpoint *)&local_13c);
              if (bVar2) {
                poVar5 = std::operator<<((ostream *)&std::cout,"  ");
                poVar5 = std::operator<<(poVar5,stack0xfffffffffffffed0->name);
                poVar5 = std::operator<<(poVar5," = [");
                sVar9 = mpt::point<float>::span(&local_13c);
                local_150 = sVar9;
                poVar5 = operator<<(poVar5,&local_150);
                poVar5 = std::operator<<(poVar5,']');
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              }
              else {
                poVar5 = std::operator<<((ostream *)&std::cout,"  ");
                poVar5 = std::operator<<(poVar5,stack0xfffffffffffffed0->name);
                poVar5 = std::operator<<(poVar5," = ");
                pvVar7 = (void *)operator<<(poVar5,&stack0xfffffffffffffed0->val);
                std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
              }
            }
            mpt::object::const_iterator::operator++((const_iterator *)&__end2._pos);
          }
          poVar5 = std::operator<<((ostream *)&std::cout,"}");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        bVar1 = mpt::layout::reset();
        if ((bVar1 & 1) == 0) {
          mpt::error("main","%s: %s","unable to reset layout parser",argv[1]);
          argv_local._4_4_ = 4;
          __range1._0_4_ = 1;
        }
        else {
          __range1._0_4_ = 0;
        }
      }
    }
  }
  mpt::layout::~layout(local_58);
  return argv_local._4_4_;
}

Assistant:

extern int main(int argc, char *argv[])
{
	mtrace();
	
	mpt::layout lay;
	
	if (argc < 2) {
		mpt::warning(__func__, "%s", "missing layout argument");
		return 1;
	}
	if (!lay.open(argv[1])) {
		mpt::error(__func__, "%s: %s", "unable to open layout", argv[1]);
		return 2;
	}
	if (!lay.load()) {
		mpt::error(__func__, "%s: %s", "unable to load layout", argv[1]);
		return 3;
	}
	for (const mpt::item<mpt::layout::graph> &g : lay.graphs()) {
		std::cout << g.name() << " {" << std::endl;
		const mpt::object &o = *g.instance();
		for (const mpt::property &p : o) {
			mpt::color col;
			if (p.val.get(col)) {
				std::cout << "  " << p.name << " = " << col << std::endl;
				continue;
			}
			mpt::fpoint fp;
			if (p.val.get(fp)) {
				std::cout << "  " << p.name << " = [" << fp.span() << ']' << std::endl;
				continue;
			}
			std::cout << "  " << p.name << " = " << p.val << std::endl;
		}
		std::cout << "}" << std::endl;
	}
	if (!lay.reset()) {
		mpt::error(__func__, "%s: %s", "unable to reset layout parser", argv[1]);
		return 4;
	}
}